

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void GUILog(HGUI handle,string *log)

{
  if (*(long *)((long)handle + 0x1a0cb0) != 0) {
    std::__cxx11::string::append((char *)((long)handle + 0x1a0ca8));
  }
  std::__cxx11::string::append((string *)((long)handle + 0x1a0ca8));
  return;
}

Assistant:

void GUILog(HGUI handle, std::string log) {
    GUI* gui = (GUI*)handle;
    if (!gui->Log.empty()) {
        gui->Log += "\n";
    }
    gui->Log += log;
}